

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

void read_num_bytes(char *buf,CVmDataSource *src,size_t len,CVmPackType *t)

{
  int iVar1;
  
  iVar1 = (*src->_vptr_CVmDataSource[2])(src,buf);
  if (iVar1 != 0) {
    err_throw(0x65);
  }
  if ((1 < len) && (t->big_endian != 0)) {
    reverse_bytes(buf,len);
    return;
  }
  return;
}

Assistant:

static void read_num_bytes(char *buf, CVmDataSource *src, size_t len,
                           const CVmPackType *t)
{
    /* read the bytes */
    if (src->read(buf, len))
        err_throw(VMERR_READ_FILE);

    /* 
     *   if the source is in big-endian order, swap the bytes to get our
     *   standard little-endian order 
     */
    if (len > 1 && t->big_endian)
        reverse_bytes(buf, len);
}